

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string_view name,string_view relative_to,
          PlaceholderType placeholder_type,ResolveMode resolve_mode,bool build_it)

{
  string_view name_00;
  bool bVar1;
  bool build_it_local;
  PlaceholderType placeholder_type_local;
  DescriptorBuilder *this_local;
  string_view relative_to_local;
  string_view name_local;
  Symbol result;
  
  name_local._M_len = (size_t)name._M_str;
  name_local._M_str = (char *)LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it)
  ;
  bVar1 = Symbol::IsNull((Symbol *)&name_local._M_str);
  if ((bVar1) && ((this->pool_->allow_unknown_ & 1U) != 0)) {
    name_00._M_str = (char *)name_local._M_len;
    name_00._M_len = name._M_len;
    name_local._M_str =
         (char *)DescriptorPool::NewPlaceholderWithMutexHeld(this->pool_,name_00,placeholder_type);
  }
  return (Symbol)(SymbolBase *)name_local._M_str;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const absl::string_view name, const absl::string_view relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}